

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

int addexpr(easm_expr **iex,easm_expr *expr,int flip)

{
  easm_expr *peVar1;
  int flip_local;
  easm_expr *expr_local;
  easm_expr **iex_local;
  
  if (flip == 0) {
    if (*iex == (easm_expr *)0x0) {
      *iex = expr;
    }
    else {
      peVar1 = easm_expr_bin(EASM_EXPR_ADD,*iex,expr);
      *iex = peVar1;
    }
  }
  else if (*iex == (easm_expr *)0x0) {
    peVar1 = easm_expr_un(EASM_EXPR_NEG,expr);
    *iex = peVar1;
  }
  else {
    peVar1 = easm_expr_bin(EASM_EXPR_SUB,*iex,expr);
    *iex = peVar1;
  }
  return 1;
}

Assistant:

int addexpr (struct easm_expr **iex, struct easm_expr *expr, int flip) {
	if (flip) {
		if (!*iex)
			*iex = easm_expr_un(EASM_EXPR_NEG, expr);
		else
			*iex = easm_expr_bin(EASM_EXPR_SUB, *iex, expr);
	} else {
		if (!*iex)
			*iex = expr;
		else
			*iex = easm_expr_bin(EASM_EXPR_ADD, *iex, expr);
	}
	return 1;
}